

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::handleEntryPointAttributes
          (HlslParseContext *this,TSourceLoc *loc,TAttributes *attributes)

{
  _List_node_base *this_00;
  int iVar1;
  TVertexSpacing TVar2;
  TVertexOrder TVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  TLayoutGeometry TVar8;
  TVertexOrder TVar9;
  TIntermediate *pTVar10;
  char *pcVar11;
  char *pcVar12;
  _List_node_header *p_Var13;
  _List_node_base *p_Var14;
  _func_int **pp_Var15;
  TLayoutGeometry TVar16;
  int lid;
  TVertexSpacing TVar17;
  long lVar18;
  TString domainStr;
  
  p_Var13 = &(attributes->
             super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>)
             .
             super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
             ._M_impl._M_node;
  p_Var14 = &p_Var13->super__List_node_base;
switchD_0038b557_caseD_16:
  p_Var14 = ((_List_node_base *)&p_Var14->_M_next)->_M_next;
  if ((_List_node_header *)p_Var14 == p_Var13) {
    return;
  }
  if (*(int *)&p_Var14[1]._M_next - 4U < 0x15) goto code_r0x0038b545;
  goto switchD_0038b557_caseD_6;
code_r0x0038b545:
  this_00 = p_Var14 + 1;
  switch(*(int *)&p_Var14[1]._M_next) {
  case 4:
    domainStr._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    domainStr._M_dataplus._M_p = (pointer)&domainStr.field_2;
    domainStr._M_string_length = 0;
    domainStr.field_2._M_local_buf[0] = '\0';
    bVar4 = TAttributeArgs::getString((TAttributeArgs *)this_00,&domainStr,0,true);
    if (bVar4) {
      bVar4 = std::operator==(&domainStr,"tri");
      TVar16 = ElgTriangles;
      if (!bVar4) {
        bVar4 = std::operator==(&domainStr,"quad");
        TVar16 = ElgQuads;
        if (!bVar4) {
          bVar4 = std::operator==(&domainStr,"isoline");
          TVar16 = ElgIsolines;
          if (!bVar4) {
            TVar16 = ElgNone;
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"unsupported domain type",domainStr._M_dataplus._M_p,"");
          }
        }
      }
      pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessEvaluation) {
        TVar8 = pTVar10->inputPrimitive;
        if (TVar8 == ElgNone) {
          pTVar10->inputPrimitive = TVar16;
          goto switchD_0038b557_caseD_16;
        }
      }
      else {
        TVar8 = pTVar10->outputPrimitive;
        if (TVar8 == ElgNone) {
          pTVar10->outputPrimitive = TVar16;
          goto switchD_0038b557_caseD_16;
        }
      }
      if (TVar8 == TVar16) goto switchD_0038b557_caseD_16;
      pcVar11 = TQualifier::getGeometryString(TVar16);
      pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar12 = "cannot change previously set domain";
      goto LAB_0038b9f4;
    }
    pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar12 = "invalid domain";
    break;
  case 5:
    ((this->super_TParseContextBase).super_TParseVersions.intermediate)->earlyFragmentTests = true;
    goto switchD_0038b557_caseD_16;
  default:
switchD_0038b557_caseD_6:
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
              (this,loc,"attribute does not apply to entry point","","");
    goto switchD_0038b557_caseD_16;
  case 9:
    bVar4 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&domainStr,0);
    if (bVar4) {
      pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar1 = pTVar10->invocations;
      if (iVar1 == -1) {
        pTVar10->invocations = (int)domainStr._M_dataplus.super_allocator_type.allocator;
        goto switchD_0038b557_caseD_16;
      }
      if (iVar1 == (int)domainStr._M_dataplus.super_allocator_type.allocator)
      goto switchD_0038b557_caseD_16;
      pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar12 = "cannot change previously set instance attribute";
    }
    else {
      pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar12 = "invalid instance";
    }
    break;
  case 0xb:
    lVar6 = (*(code *)(p_Var14[1]._M_prev)->_M_next[0x19]._M_prev)();
    for (lVar18 = 0; lVar18 < (int)((ulong)(*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8)) >> 3);
        lVar18 = lVar18 + 1) {
      pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      lVar7 = (**(code **)(**(long **)(*(long *)(lVar6 + 8) + lVar18 * 8) + 0x28))();
      if (pTVar10->localSizeNotDefault[lVar18] == false) {
        iVar1 = **(int **)(*(long *)(lVar7 + 0xc0) + 8);
        pTVar10->localSizeNotDefault[lVar18] = true;
        pTVar10->localSize[lVar18] = iVar1;
      }
    }
    goto switchD_0038b557_caseD_16;
  case 0xc:
    bVar4 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&domainStr,0);
    if (bVar4) {
      pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if (pTVar10->vertices == -1) {
LAB_0038ba02:
        pTVar10->vertices = (int)domainStr._M_dataplus.super_allocator_type.allocator;
        goto switchD_0038b557_caseD_16;
      }
      if (pTVar10->vertices == (int)domainStr._M_dataplus.super_allocator_type.allocator)
      goto switchD_0038b557_caseD_16;
      pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar12 = "cannot change previously set maxvertexcount attribute";
    }
    else {
      pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar12 = "invalid maxvertexcount";
    }
    break;
  case 0xd:
    bVar4 = TAttributeArgs::getInt((TAttributeArgs *)this_00,(int *)&domainStr,0);
    if (bVar4) {
      pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if (pTVar10->vertices == -1) goto LAB_0038ba02;
      if (pTVar10->vertices == (int)domainStr._M_dataplus.super_allocator_type.allocator)
      goto switchD_0038b557_caseD_16;
      pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar12 = "cannot change previously set outputcontrolpoints attribute";
    }
    else {
      pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar12 = "invalid outputcontrolpoints";
    }
    break;
  case 0xe:
    domainStr._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    domainStr._M_dataplus._M_p = (pointer)&domainStr.field_2;
    domainStr._M_string_length = 0;
    domainStr.field_2._M_local_buf[0] = '\0';
    bVar4 = TAttributeArgs::getString((TAttributeArgs *)this_00,&domainStr,0,true);
    if (bVar4) {
      bVar4 = std::operator==(&domainStr,"point");
      if (bVar4) {
        ((this->super_TParseContextBase).super_TParseVersions.intermediate)->pointMode = true;
        goto switchD_0038b557_caseD_16;
      }
      bVar4 = std::operator==(&domainStr,"line");
      TVar16 = ElgIsolines;
      if (!bVar4) {
        bVar4 = std::operator==(&domainStr,"triangle_cw");
        TVar9 = EvoCw;
        if (!bVar4) {
          bVar5 = std::operator==(&domainStr,"triangle_ccw");
          TVar9 = EvoCcw;
          if (!bVar5) {
            pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar12 = "unsupported outputtopology type";
            pcVar11 = domainStr._M_dataplus._M_p;
            goto LAB_0038b9f4;
          }
        }
        pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        TVar3 = pTVar10->vertexOrder;
        if (TVar3 == EvoNone) {
          pTVar10->vertexOrder = TVar9;
        }
        else {
          TVar16 = ElgTriangles;
          if (TVar3 == TVar9) goto LAB_0038bb15;
          pcVar12 = ", ccw";
          if (bVar4) {
            pcVar12 = ", cw";
          }
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot change previously set outputtopology",pcVar12 + 2,"");
        }
        TVar16 = ElgTriangles;
      }
LAB_0038bb15:
      pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      if (pTVar10->outputPrimitive == ElgNone) {
        pTVar10->outputPrimitive = TVar16;
      }
      goto switchD_0038b557_caseD_16;
    }
    pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar12 = "invalid outputtopology";
    break;
  case 0xf:
    domainStr._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    domainStr._M_dataplus._M_p = (pointer)&domainStr.field_2;
    domainStr._M_string_length = 0;
    domainStr.field_2._M_local_buf[0] = '\0';
    bVar4 = TAttributeArgs::getString((TAttributeArgs *)this_00,&domainStr,0,true);
    if (bVar4) {
      bVar4 = std::operator==(&domainStr,"integer");
      TVar17 = EvsEqual;
      if (!bVar4) {
        bVar4 = std::operator==(&domainStr,"fractional_even");
        TVar17 = EvsFractionalEven;
        if (!bVar4) {
          bVar4 = std::operator==(&domainStr,"fractional_odd");
          TVar17 = EvsFractionalOdd;
          if (!bVar4) {
            TVar17 = EvsNone;
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"unsupported partitioning type",domainStr._M_dataplus._M_p,"");
          }
        }
      }
      pTVar10 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      TVar2 = pTVar10->vertexSpacing;
      if (TVar2 == EvsNone) {
        pTVar10->vertexSpacing = TVar17;
        goto switchD_0038b557_caseD_16;
      }
      if (TVar2 == TVar17) goto switchD_0038b557_caseD_16;
      pcVar12 = (char *)((long)&DAT_00730520 + (long)(int)(&DAT_00730520)[TVar17]);
      pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar11 = "cannot change previously set partitioning";
    }
    else {
      pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar11 = "invalid partitioning";
      pcVar12 = "";
    }
    (*pp_Var15[0x2d])(this,loc,pcVar11,pcVar12,"");
    goto switchD_0038b557_caseD_16;
  case 0x10:
    domainStr._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    domainStr._M_dataplus._M_p = (pointer)&domainStr.field_2;
    domainStr._M_string_length = 0;
    domainStr.field_2._M_local_buf[0] = '\0';
    bVar4 = TAttributeArgs::getString((TAttributeArgs *)this_00,&domainStr,0,false);
    if (bVar4) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_assign(&this->patchConstantFunctionName,&domainStr);
      goto switchD_0038b557_caseD_16;
    }
    pp_Var15 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar12 = "invalid patch constant function";
    break;
  case 0x16:
  case 0x18:
    goto switchD_0038b557_caseD_16;
  }
  pcVar11 = "";
LAB_0038b9f4:
  (*pp_Var15[0x2d])(this,loc,pcVar12,pcVar11,"");
  goto switchD_0038b557_caseD_16;
}

Assistant:

void HlslParseContext::handleEntryPointAttributes(const TSourceLoc& loc, const TAttributes& attributes)
{
    for (auto it = attributes.begin(); it != attributes.end(); ++it) {
        switch (it->name) {
        case EatNumThreads:
        {
            const TIntermSequence& sequence = it->args->getSequence();
            for (int lid = 0; lid < int(sequence.size()); ++lid)
                intermediate.setLocalSize(lid, sequence[lid]->getAsConstantUnion()->getConstArray()[0].getIConst());
            break;
        }
        case EatInstance: 
        {
            int invocations;

            if (!it->getInt(invocations)) {
                error(loc, "invalid instance", "", "");
            } else {
                if (!intermediate.setInvocations(invocations))
                    error(loc, "cannot change previously set instance attribute", "", "");
            }
            break;
        }
        case EatMaxVertexCount:
        {
            int maxVertexCount;

            if (! it->getInt(maxVertexCount)) {
                error(loc, "invalid maxvertexcount", "", "");
            } else {
                if (! intermediate.setVertices(maxVertexCount))
                    error(loc, "cannot change previously set maxvertexcount attribute", "", "");
            }
            break;
        }
        case EatPatchConstantFunc:
        {
            TString pcfName;
            if (! it->getString(pcfName, 0, false)) {
                error(loc, "invalid patch constant function", "", "");
            } else {
                patchConstantFunctionName = pcfName;
            }
            break;
        }
        case EatDomain:
        {
            // Handle [domain("...")]
            TString domainStr;
            if (! it->getString(domainStr)) {
                error(loc, "invalid domain", "", "");
            } else {
                TLayoutGeometry domain = ElgNone;

                if (domainStr == "tri") {
                    domain = ElgTriangles;
                } else if (domainStr == "quad") {
                    domain = ElgQuads;
                } else if (domainStr == "isoline") {
                    domain = ElgIsolines;
                } else {
                    error(loc, "unsupported domain type", domainStr.c_str(), "");
                }

                if (language == EShLangTessEvaluation) {
                    if (! intermediate.setInputPrimitive(domain))
                        error(loc, "cannot change previously set domain", TQualifier::getGeometryString(domain), "");
                } else {
                    if (! intermediate.setOutputPrimitive(domain))
                        error(loc, "cannot change previously set domain", TQualifier::getGeometryString(domain), "");
                }
            }
            break;
        }
        case EatOutputTopology:
        {
            // Handle [outputtopology("...")]
            TString topologyStr;
            if (! it->getString(topologyStr)) {
                error(loc, "invalid outputtopology", "", "");
            } else {
                TVertexOrder vertexOrder = EvoNone;
                TLayoutGeometry primitive = ElgNone;

                if (topologyStr == "point") {
                    intermediate.setPointMode();
                } else if (topologyStr == "line") {
                    primitive = ElgIsolines;
                } else if (topologyStr == "triangle_cw") {
                    vertexOrder = EvoCw;
                    primitive = ElgTriangles;
                } else if (topologyStr == "triangle_ccw") {
                    vertexOrder = EvoCcw;
                    primitive = ElgTriangles;
                } else {
                    error(loc, "unsupported outputtopology type", topologyStr.c_str(), "");
                }

                if (vertexOrder != EvoNone) {
                    if (! intermediate.setVertexOrder(vertexOrder)) {
                        error(loc, "cannot change previously set outputtopology",
                              TQualifier::getVertexOrderString(vertexOrder), "");
                    }
                }
                if (primitive != ElgNone)
                    intermediate.setOutputPrimitive(primitive);
            }
            break;
        }
        case EatPartitioning:
        {
            // Handle [partitioning("...")]
            TString partitionStr;
            if (! it->getString(partitionStr)) {
                error(loc, "invalid partitioning", "", "");
            } else {
                TVertexSpacing partitioning = EvsNone;

                if (partitionStr == "integer") {
                    partitioning = EvsEqual;
                } else if (partitionStr == "fractional_even") {
                    partitioning = EvsFractionalEven;
                } else if (partitionStr == "fractional_odd") {
                    partitioning = EvsFractionalOdd;
                    //} else if (partition == "pow2") { // TODO: currently nothing to map this to.
                } else {
                    error(loc, "unsupported partitioning type", partitionStr.c_str(), "");
                }

                if (! intermediate.setVertexSpacing(partitioning))
                    error(loc, "cannot change previously set partitioning",
                          TQualifier::getVertexSpacingString(partitioning), "");
            }
            break;
        }
        case EatOutputControlPoints:
        {
            // Handle [outputcontrolpoints("...")]
            int ctrlPoints;
            if (! it->getInt(ctrlPoints)) {
                error(loc, "invalid outputcontrolpoints", "", "");
            } else {
                if (! intermediate.setVertices(ctrlPoints)) {
                    error(loc, "cannot change previously set outputcontrolpoints attribute", "", "");
                }
            }
            break;
        }
        case EatEarlyDepthStencil:
            intermediate.setEarlyFragmentTests();
            break;
        case EatBuiltIn:
        case EatLocation:
            // tolerate these because of dual use of entrypoint and type attributes
            break;
        default:
            warn(loc, "attribute does not apply to entry point", "", "");
            break;
        }
    }
}